

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_manager.cpp
# Opt level: O0

bool __thiscall miniros::ServiceManager::isServiceAdvertised(ServiceManager *this,string *serv_name)

{
  bool bVar1;
  __type_conflict _Var2;
  element_type *peVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  shared_ptr<miniros::ServicePublication> *pub;
  iterator __end1;
  iterator __begin1;
  list<std::shared_ptr<miniros::ServicePublication>,_std::allocator<std::shared_ptr<miniros::ServicePublication>_>_>
  *__range1;
  list<std::shared_ptr<miniros::ServicePublication>,_std::allocator<std::shared_ptr<miniros::ServicePublication>_>_>
  *in_stack_ffffffffffffffc8;
  _Self local_30;
  _Self local_28 [2];
  
  local_28[0]._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::shared_ptr<miniros::ServicePublication>,_std::allocator<std::shared_ptr<miniros::ServicePublication>_>_>
       ::begin(in_stack_ffffffffffffffc8);
  local_30._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::shared_ptr<miniros::ServicePublication>,_std::allocator<std::shared_ptr<miniros::ServicePublication>_>_>
       ::end(in_stack_ffffffffffffffc8);
  do {
    bVar1 = std::operator!=(local_28,&local_30);
    if (!bVar1) {
      return false;
    }
    std::_List_iterator<std::shared_ptr<miniros::ServicePublication>_>::operator*
              ((_List_iterator<std::shared_ptr<miniros::ServicePublication>_> *)0x4ae7e5);
    peVar3 = std::
             __shared_ptr_access<miniros::ServicePublication,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<miniros::ServicePublication,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x4ae7f2);
    ServicePublication::getName_abi_cxx11_(peVar3);
    _Var2 = std::operator==(in_RDI,in_RSI);
    if (_Var2) {
      peVar3 = std::
               __shared_ptr_access<miniros::ServicePublication,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<miniros::ServicePublication,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x4ae816);
      bVar1 = ServicePublication::isDropped(peVar3);
      if (!bVar1) {
        return true;
      }
    }
    std::_List_iterator<std::shared_ptr<miniros::ServicePublication>_>::operator++(local_28);
  } while( true );
}

Assistant:

bool ServiceManager::isServiceAdvertised(const string& serv_name)
{
  for (auto & pub : service_publications_)
  {
    if (pub->getName() == serv_name && !pub->isDropped())
      return true;
  }

  return false;
}